

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QMovableArrayOps<QPainterPath>::emplace<QPainterPath_const&>
          (QMovableArrayOps<QPainterPath> *this,qsizetype i,QPainterPath *args)

{
  QPainterPath **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QPainterPath *pQVar4;
  QPainterPath *pQVar5;
  long in_FS_OFFSET;
  bool bVar6;
  QPainterPath tmp;
  Inserter local_68;
  QPainterPath local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_003f1e96:
    local_40.d_ptr.d.ptr = (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QPainterPath::QPainterPath(&local_40,args);
    bVar6 = (this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.size
            != 0;
    QArrayDataPointer<QPainterPath>::detachAndGrow
              ((QArrayDataPointer<QPainterPath> *)this,(uint)(i == 0 && bVar6),1,
               (QPainterPath **)0x0,(QArrayDataPointer<QPainterPath> *)0x0);
    if (i == 0 && bVar6) {
      QPainterPath::QPainterPath
                ((this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
                 ptr + -1,&local_40);
      ppQVar1 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
      pqVar2 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
                size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      pQVar5 = (this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
               ptr;
      pQVar4 = pQVar5 + i;
      pQVar5 = pQVar5 + i + 1;
      local_68.nInserts = 1;
      local_68.bytes =
           ((this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.size
           - i) * 8;
      local_68.data = (QArrayDataPointer<QPainterPath> *)this;
      local_68.displaceTo = pQVar5;
      memmove(pQVar5,pQVar4,local_68.bytes);
      QPainterPath::QPainterPath(pQVar4,&local_40);
      local_68.displaceFrom = pQVar5;
      Inserter::~Inserter(&local_68);
    }
    QPainterPath::~QPainterPath(&local_40);
  }
  else {
    if (((this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.size ==
         i) && (pQVar4 = (this->super_QGenericArrayOps<QPainterPath>).
                         super_QArrayDataPointer<QPainterPath>.ptr,
               (pDVar3->super_QArrayData).alloc !=
               ((long)((long)pQVar4 -
                      ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0))
               >> 3) + i)) {
      QPainterPath::QPainterPath(pQVar4 + i,args);
    }
    else {
      if ((i != 0) ||
         (pQVar4 = (this->super_QGenericArrayOps<QPainterPath>).
                   super_QArrayDataPointer<QPainterPath>.ptr,
         (QPainterPath *)
         ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) == pQVar4))
      goto LAB_003f1e96;
      QPainterPath::QPainterPath(pQVar4 + -1,args);
      ppQVar1 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
                 ptr;
      *ppQVar1 = *ppQVar1 + -1;
    }
    pqVar2 = &(this->super_QGenericArrayOps<QPainterPath>).super_QArrayDataPointer<QPainterPath>.
              size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }